

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# DeviceContextVkImpl.cpp
# Opt level: O2

void __thiscall
Diligent::DeviceContextVkImpl::DisposeCurrentCmdBuffer
          (DeviceContextVkImpl *this,SoftwareQueueIndex CmdQueue,Uint64 FenceValue)

{
  VkCommandBuffer vkCmdBuff;
  string msg;
  string local_40;
  
  if (((this->m_CommandBuffer).m_State.RenderPass != (VkRenderPass)0x0) ||
     ((this->m_CommandBuffer).m_State.DynamicRenderingHash != 0)) {
    FormatString<char[53]>
              (&local_40,(char (*) [53])"Disposing command buffer with unfinished render pass");
    DebugAssertionFailed
              (local_40._M_dataplus._M_p,"DisposeCurrentCmdBuffer",
               "/workspace/llm4binary/github/license_c_cmakelists/DiligentGraphics[P]DiligentCore/Graphics/GraphicsEngineVulkan/src/DeviceContextVkImpl.cpp"
               ,0x109);
    std::__cxx11::string::~string((string *)&local_40);
  }
  vkCmdBuff = (this->m_CommandBuffer).m_VkCmdBuffer;
  if (vkCmdBuff != (VkCommandBuffer)0x0) {
    DisposeVkCmdBuffer(this,CmdQueue,vkCmdBuff,FenceValue);
    VulkanUtilities::VulkanCommandBuffer::Reset(&this->m_CommandBuffer);
  }
  return;
}

Assistant:

inline void DeviceContextVkImpl::DisposeCurrentCmdBuffer(SoftwareQueueIndex CmdQueue, Uint64 FenceValue)
{
    VERIFY(!m_CommandBuffer.IsInRenderScope(), "Disposing command buffer with unfinished render pass");
    VkCommandBuffer vkCmdBuff = m_CommandBuffer.GetVkCmdBuffer();
    if (vkCmdBuff != VK_NULL_HANDLE)
    {
        DisposeVkCmdBuffer(CmdQueue, vkCmdBuff, FenceValue);
        m_CommandBuffer.Reset();
    }
}